

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O1

void __thiscall
cs::stack_type<cs::domain_type,_std::allocator>::pop_no_return
          (stack_type<cs::domain_type,_std::allocator> *this)

{
  error *this_00;
  string local_38;
  
  if (this->m_current != this->m_start) {
    domain_type::~domain_type(this->m_current + -1);
    this->m_current = this->m_current + -1;
    return;
  }
  this_00 = (error *)__cxa_allocate_exception(0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"E000H","");
  cov::error::error(this_00,&local_38);
  __cxa_throw(this_00,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

inline void pop_no_return()
		{
			if (empty())
				throw cov::error("E000H");
			(m_current - 1)->~T();
			--m_current;
		}